

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O2

MontgomeryPoint * mpoint(MontgomeryCurve *wc,size_t index)

{
  mp_int *x;
  MontgomeryPoint *pMVar1;
  
  if (index < 7) {
    x = mp__from_string_literal(&DAT_001230e0 + *(int *)(&DAT_001230e0 + index * 4));
    pMVar1 = ecc_montgomery_point_new(wc,x);
    mp_free(x);
    return pMVar1;
  }
  __assert_fail("false && \"only 7 example Weierstrass points defined\"",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                0x402,"MontgomeryPoint *mpoint(MontgomeryCurve *, size_t)");
}

Assistant:

static MontgomeryPoint *mpoint(MontgomeryCurve *wc, size_t index)
{
    mp_int *x = NULL;
    MontgomeryPoint *mp;
    switch (index) {
      case 0:
        x = MP_LITERAL(31415);
        break;
      case 1:
        x = MP_LITERAL(0x4d352c654c06eecfe19104118857b38398e8);
        break;
      case 2:
        x = MP_LITERAL(0x03fca2a73983bc3434caae3134599cd69cce);
        break;
      case 3:
        x = MP_LITERAL(0xa0fd735ce9b3406498b5f035ee655bda4e15);
        break;
      case 4:
        x = MP_LITERAL(0x7c7f46a00cc286dbe47db39b6d8f5efd920e);
        break;
      case 5:
        x = MP_LITERAL(0x07a6dc30d3b320448e6f8999be417e6b7c6b);
        break;
      case 6:
        x = MP_LITERAL(0x7832da5fc16dfbd358170b2b96896cd3cd06);
        break;
      default:
        unreachable("only 7 example Weierstrass points defined");
    }
    mp = ecc_montgomery_point_new(wc, x);
    mp_free(x);
    return mp;
}